

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::seeDoes(Forth *this,AAddr does)

{
  Cell CVar1;
  Xt index;
  _Setbase _Var2;
  AAddr pointer;
  ostream *poVar3;
  Definition *pDVar4;
  FCell FVar5;
  CAddr local_14;
  Xt xt;
  AAddr does_local;
  Forth *this_local;
  
  pointer = does;
  while (local_14 = pointer, CVar1 = getDataCell(this,local_14), CVar1 != 4) {
    CVar1 = getDataCell(this,local_14);
    index = findXt(this,CVar1);
    if (index == 0) {
      poVar3 = std::operator<<((ostream *)&this->field_0x20," ");
      CVar1 = getNumericBase(this);
      _Var2 = std::setbase(CVar1);
      poVar3 = std::operator<<(poVar3,_Var2);
      CVar1 = getDataCell(this,local_14);
      std::ostream::operator<<(poVar3,CVar1);
    }
    else {
      poVar3 = std::operator<<((ostream *)&this->field_0x20," ");
      pDVar4 = definitionsAt(this,index);
      std::operator<<(poVar3,(string *)&pDVar4->name);
    }
    pointer = local_14 + 4;
    if (((index == 5) || (index == 6)) || (index == 1)) {
      poVar3 = std::operator<<((ostream *)&this->field_0x20," ");
      CVar1 = getDataCell(this,pointer);
      std::ostream::operator<<(poVar3,CVar1);
      pointer = local_14 + 8;
    }
    else if (index == 0x12) {
      poVar3 = std::operator<<((ostream *)&this->field_0x20," ");
      FVar5 = getDataFCell(this,pointer);
      std::ostream::operator<<(poVar3,FVar5);
      pointer = local_14 + 0xc;
    }
  }
  std::operator<<((ostream *)&this->field_0x20," ;");
  return;
}

Assistant:

void seeDoes(AAddr does) {
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			while (XT(getDataCell( does )) != endOfDefinitionXt) {
				auto xt = findXt(getDataCell(does));
				if (xt)
					std_cout << " " << definitionsAt(xt).name;
				else
					std_cout << " " << SETBASE() << static_cast<SCell>(getDataCell(does));
				does+=sizeof(Cell);	
				if(xt==branchXt || xt==zbranchXt || xt==doLiteralXt ){
				 
				 std_cout << " " <<  getDataCell(does)	;
				 does+=sizeof(Cell);
				} else 
				if( xt==doFLiteralXt ){
				 std_cout << " " <<  getDataFCell(does)	;
				 does+=sizeof(FCell);
				}	
				
			}
			std_cout << " ;";
#endif
		}